

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool __thiscall ON_FontMetrics::IsUnset(ON_FontMetrics *this)

{
  bool bVar1;
  undefined4 in_ECX;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  
  auVar4._0_4_ = -(uint)(this->m_UPM == 0);
  auVar4._4_4_ = -(uint)(this->m_ascent == 0);
  auVar4._8_4_ = -(uint)(this->m_descent == 0);
  auVar4._12_4_ = -(uint)(this->m_line_space == 0);
  iVar2 = movmskps(in_ECX,auVar4);
  bVar1 = false;
  bVar3 = false;
  if ((((iVar2 == 0xf) &&
       (bVar3 = bVar1,
       (this->m_strikeout_position == 0 && this->m_strikeout_thickness == 0) &&
       this->m_underscore_thickness == 0)) && (this->m_ascent_of_capital == 0)) &&
     (this->m_ascent_of_x == 0)) {
    bVar3 = this->m_underscore_position == 0;
  }
  return bVar3;
}

Assistant:

bool ON_FontMetrics::IsUnset() const
{
  return (
    0 == m_UPM
    && 0 == m_ascent
    && 0 == m_descent
    && 0 == m_line_space
    && 0 == m_ascent_of_capital
    && 0 == m_ascent_of_x
    && 0 == m_strikeout_thickness
    && 0 == m_strikeout_position
    && 0 == m_underscore_thickness
    && 0 == m_underscore_position
    );
}